

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plutovg-path.c
# Opt level: O2

void plutovg_path_traverse_flatten
               (plutovg_path_t *path,plutovg_path_traverse_func_t traverse_func,void *closure)

{
  undefined8 uVar1;
  plutovg_point_t pVar2;
  plutovg_path_command_t pVar3;
  long lVar4;
  float fVar5;
  float fVar6;
  undefined8 uVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  undefined8 uVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  plutovg_point_t local_488;
  plutovg_point_t local_470;
  plutovg_path_iterator_t it;
  plutovg_point_t points [3];
  plutovg_point_t local_438;
  plutovg_point_t local_430 [4];
  float afStack_410 [4];
  undefined8 auStack_400 [122];
  
  if (path->num_curves == 0) {
    plutovg_path_traverse(path,traverse_func,closure);
    return;
  }
  it.elements = (path->elements).data;
  it.size = (path->elements).size;
  it.index = 0;
  local_488.x = 0.0;
  local_488.y = 0.0;
  do {
    while( true ) {
      if (it.size <= it.index) {
        return;
      }
      pVar3 = plutovg_path_iterator_next(&it,points);
      if (pVar3 < PLUTOVG_PATH_COMMAND_CUBIC_TO) break;
      if (pVar3 == PLUTOVG_PATH_COMMAND_CUBIC_TO) {
        local_438 = local_488;
        local_430[0] = points[0];
        local_430[1] = points[1];
        local_430[2] = points[2];
        lVar4 = 0;
        while (-1 < lVar4) {
          uVar1 = *(undefined8 *)((long)&local_438.x + lVar4);
          fVar5 = (float)uVar1;
          fVar6 = (float)((ulong)uVar1 >> 0x20);
          pVar2 = *(plutovg_point_t *)((long)&local_430[2].x + lVar4);
          fVar14 = pVar2.x - fVar5;
          fVar15 = pVar2.y - fVar6;
          if (ABS(fVar15) + ABS(fVar14) <= 1.0) {
            uVar7 = *(undefined8 *)((long)&local_430[0].x + lVar4);
            uVar11 = *(undefined8 *)((long)&local_430[1].x + lVar4);
            fVar16 = ABS(fVar6 - (float)((ulong)uVar11 >> 0x20)) +
                     ABS(fVar5 - (float)uVar11) +
                     ABS(fVar6 - (float)((ulong)uVar7 >> 0x20)) + ABS(fVar5 - (float)uVar7);
            fVar14 = 0.25;
          }
          else {
            uVar7 = *(undefined8 *)((long)&local_430[0].x + lVar4);
            uVar11 = *(undefined8 *)((long)&local_430[1].x + lVar4);
            fVar16 = ABS(fVar14 * (fVar6 - (float)((ulong)uVar11 >> 0x20)) -
                         fVar15 * (fVar5 - (float)uVar11)) +
                     ABS(fVar14 * (fVar6 - (float)((ulong)uVar7 >> 0x20)) -
                         fVar15 * (fVar5 - (float)uVar7));
            fVar14 = (ABS(fVar15) + ABS(fVar14)) * 0.25;
          }
          if ((lVar4 == 0x3e0) || (fVar16 < fVar14)) {
            local_470 = pVar2;
            (*traverse_func)(closure,PLUTOVG_PATH_COMMAND_LINE_TO,&local_470,1);
            lVar4 = lVar4 + -0x20;
          }
          else {
            *(undefined8 *)((long)&local_430[3].x + lVar4) = uVar1;
            fVar8 = (float)((ulong)uVar7 >> 0x20);
            fVar9 = (float)((ulong)uVar11 >> 0x20);
            fVar5 = (fVar5 + (float)uVar7) * 0.5;
            fVar6 = (fVar6 + fVar8) * 0.5;
            fVar14 = (pVar2.x + (float)uVar11) * 0.5;
            fVar15 = (pVar2.y + fVar9) * 0.5;
            fVar16 = ((float)uVar7 + (float)uVar11) * 0.5;
            fVar8 = (fVar8 + fVar9) * 0.5;
            fVar9 = (fVar5 + fVar16) * 0.5;
            fVar12 = (fVar6 + fVar8) * 0.5;
            fVar16 = (fVar16 + fVar14) * 0.5;
            fVar8 = (fVar8 + fVar15) * 0.5;
            fVar10 = (fVar9 + fVar16) * 0.5;
            fVar13 = (fVar12 + fVar8) * 0.5;
            *(ulong *)((long)&local_430[1].x + lVar4) = CONCAT44(fVar15,fVar14);
            *(float *)((long)afStack_410 + lVar4) = fVar5;
            *(float *)((long)afStack_410 + lVar4 + 4) = fVar6;
            *(float *)((long)afStack_410 + lVar4 + 8) = fVar9;
            *(float *)((long)afStack_410 + lVar4 + 0xc) = fVar12;
            *(float *)((long)&local_438.x + lVar4) = fVar10;
            *(float *)((long)&local_438.y + lVar4) = fVar13;
            *(float *)((long)&local_430[0].x + lVar4) = fVar16;
            *(float *)((long)&local_430[0].y + lVar4) = fVar8;
            *(ulong *)((long)auStack_400 + lVar4) = CONCAT44(fVar13,fVar10);
            lVar4 = lVar4 + 0x20;
          }
        }
        local_488 = points[2];
      }
      else if (pVar3 == PLUTOVG_PATH_COMMAND_CLOSE) break;
    }
    (*traverse_func)(closure,pVar3,points,1);
    local_488 = points[0];
  } while( true );
}

Assistant:

void plutovg_path_traverse_flatten(const plutovg_path_t* path, plutovg_path_traverse_func_t traverse_func, void* closure)
{
    if(path->num_curves == 0) {
        plutovg_path_traverse(path, traverse_func, closure);
        return;
    }

    const float threshold = 0.25f;

    plutovg_path_iterator_t it;
    plutovg_path_iterator_init(&it, path);

    bezier_t beziers[32];
    plutovg_point_t points[3];
    plutovg_point_t current_point = {0, 0};
    while(plutovg_path_iterator_has_next(&it)) {
        plutovg_path_command_t command = plutovg_path_iterator_next(&it, points);
        switch(command) {
        case PLUTOVG_PATH_COMMAND_MOVE_TO:
        case PLUTOVG_PATH_COMMAND_LINE_TO:
        case PLUTOVG_PATH_COMMAND_CLOSE:
            traverse_func(closure, command, points, 1);
            current_point = points[0];
            break;
        case PLUTOVG_PATH_COMMAND_CUBIC_TO:
            beziers[0].x1 = current_point.x;
            beziers[0].y1 = current_point.y;
            beziers[0].x2 = points[0].x;
            beziers[0].y2 = points[0].y;
            beziers[0].x3 = points[1].x;
            beziers[0].y3 = points[1].y;
            beziers[0].x4 = points[2].x;
            beziers[0].y4 = points[2].y;
            bezier_t* b = beziers;
            while(b >= beziers) {
                float y4y1 = b->y4 - b->y1;
                float x4x1 = b->x4 - b->x1;
                float l = fabsf(x4x1) + fabsf(y4y1);
                float d;
                if(l > 1.f) {
                    d = fabsf((x4x1)*(b->y1 - b->y2) - (y4y1)*(b->x1 - b->x2)) + fabsf((x4x1)*(b->y1 - b->y3) - (y4y1)*(b->x1 - b->x3));
                } else {
                    d = fabsf(b->x1 - b->x2) + fabsf(b->y1 - b->y2) + fabsf(b->x1 - b->x3) + fabsf(b->y1 - b->y3);
                    l = 1.f;
                }

                if(d < threshold*l || b == beziers + 31) {
                    plutovg_point_t p = { b->x4, b->y4 };
                    traverse_func(closure, PLUTOVG_PATH_COMMAND_LINE_TO, &p, 1);
                    --b;
                } else {
                    split_bezier(b, b + 1, b);
                    ++b;
                }
            }

            current_point = points[2];
            break;
        }
    }
}